

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDVertex::RemoveEdgeFromArray(ON_SubDVertex *this,ON_SubDEdge *e)

{
  ulong uVar1;
  ON_SubDEdgePtr eptr;
  unsigned_short vei;
  unsigned_short new_count;
  ON_SubDEdge *e_local;
  ON_SubDVertex *this_local;
  
  if (((e == (ON_SubDEdge *)0x0) || (this->m_edge_count == 0)) ||
     (this->m_edges == (ON_SubDEdgePtr *)0x0)) {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  else {
    eptr.m_ptr._6_2_ = 0;
    for (eptr.m_ptr._4_2_ = 0; eptr.m_ptr._4_2_ < this->m_edge_count;
        eptr.m_ptr._4_2_ = eptr.m_ptr._4_2_ + 1) {
      uVar1 = this->m_edges[eptr.m_ptr._4_2_].m_ptr;
      if (e != (ON_SubDEdge *)(uVar1 & 0xfffffffffffffff8)) {
        this->m_edges[eptr.m_ptr._6_2_].m_ptr = uVar1;
        eptr.m_ptr._6_2_ = eptr.m_ptr._6_2_ + 1;
      }
    }
    if (eptr.m_ptr._6_2_ == this->m_edge_count) {
      this_local._7_1_ = false;
    }
    else {
      this->m_edge_count = eptr.m_ptr._6_2_;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDVertex::RemoveEdgeFromArray(const ON_SubDEdge * e)
{
  if (nullptr == e || 0 == m_edge_count || nullptr == m_edges)
    return ON_SUBD_RETURN_ERROR(false);
  unsigned short new_count = 0;
  for (unsigned short vei = 0; vei < m_edge_count; ++vei)
  {
    const ON_SubDEdgePtr eptr = m_edges[vei];
    if (e == ON_SUBD_EDGE_POINTER(eptr.m_ptr))
      continue;
    m_edges[new_count++] = eptr;
  }
  if (new_count == m_edge_count)
    return false;
  m_edge_count = new_count;
  return true;
}